

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeCorrFunc.cpp
# Opt level: O2

void __thiscall OpenMD::TimeCorrFunc<int>::correlation(TimeCorrFunc<int> *this)

{
  int iVar1;
  double dVar2;
  pointer piVar3;
  pointer piVar4;
  int iVar5;
  uint i;
  ulong uVar6;
  int iVar7;
  int iVar8;
  int j;
  ulong uVar9;
  int i_1;
  double dVar10;
  double dVar11;
  double dVar12;
  
  piVar3 = (this->histogram_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar4 = (this->count_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  for (uVar6 = 0; uVar6 < this->nTimeBins_; uVar6 = uVar6 + 1) {
    piVar3[uVar6] = 0;
    piVar4[uVar6] = 0;
  }
  ProgressBar::clear((this->progressBar_)._M_t.
                     super___uniq_ptr_impl<OpenMD::ProgressBar,_std::default_delete<OpenMD::ProgressBar>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_OpenMD::ProgressBar_*,_std::default_delete<OpenMD::ProgressBar>_>
                     .super__Head_base<0UL,_OpenMD::ProgressBar_*,_false>._M_head_impl);
  iVar5 = this->nFrames_;
  iVar1 = iVar5 + 1;
  dVar11 = (double)iVar5;
  iVar7 = 0;
  for (uVar6 = 0; (long)uVar6 < (long)iVar5; uVar6 = uVar6 + 1) {
    dVar2 = (this->times_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[uVar6];
    iVar8 = 0;
    for (uVar9 = uVar6; (long)uVar9 < (long)iVar5; uVar9 = uVar9 + 1) {
      ProgressBar::setStatus
                ((this->progressBar_)._M_t.
                 super___uniq_ptr_impl<OpenMD::ProgressBar,_std::default_delete<OpenMD::ProgressBar>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_OpenMD::ProgressBar_*,_std::default_delete<OpenMD::ProgressBar>_>
                 .super__Head_base<0UL,_OpenMD::ProgressBar_*,_false>._M_head_impl,
                 (double)(iVar8 + iVar7 + 1),dVar11 * (double)iVar1 * 0.5);
      ProgressBar::update((this->progressBar_)._M_t.
                          super___uniq_ptr_impl<OpenMD::ProgressBar,_std::default_delete<OpenMD::ProgressBar>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_OpenMD::ProgressBar_*,_std::default_delete<OpenMD::ProgressBar>_>
                          .super__Head_base<0UL,_OpenMD::ProgressBar_*,_false>._M_head_impl);
      dVar12 = (this->times_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[uVar9] - dVar2;
      dVar10 = this->dtMean_;
      if (this->dtSigma_ * 6.0 * (double)iVar8 < ABS(dVar12 - (double)iVar8 * dVar10)) {
        snprintf(painCave.errMsg,2000,
                 "TimeCorrFunc::correlateBlocks: mean sampleTime (%f)\n\tin %s does not match actual time-spacing between\n\tconfigurations %d (t = %f) and %d (t = %f).\n"
                 ,dVar10,dVar2,(this->dumpFilename_)._M_dataplus._M_p,uVar6 & 0xffffffff,
                 uVar9 & 0xffffffff);
        painCave.severity = (uint)this->allowTimeFuzz_ * 2 + 1;
        painCave.isFatal = (int)(this->allowTimeFuzz_ ^ 1);
        simError();
        dVar10 = this->dtMean_;
      }
      (*(this->super_DynamicProperty)._vptr_DynamicProperty[8])
                (this,uVar6 & 0xffffffff,uVar9 & 0xffffffff,
                 (ulong)(uint)(int)(dVar12 / dVar10 + 0.5));
      iVar5 = this->nFrames_;
      iVar8 = iVar8 + 1;
    }
    iVar7 = iVar7 + iVar8;
  }
  return;
}

Assistant:

void TimeCorrFunc<T>::correlation() {
    T zeroType(0.0);
    for (unsigned int i = 0; i < nTimeBins_; ++i) {
      histogram_[i] = zeroType;
      count_[i]     = 0;
    }

    progressBar_->clear();
    RealType samples = 0.5 * (nFrames_ + 1) * nFrames_;
    int visited      = 0;

    for (int i = 0; i < nFrames_; ++i) {
      RealType time1 = times_[i];

      for (int j = i; j < nFrames_; ++j) {
        visited++;
        progressBar_->setStatus(visited, samples);
        progressBar_->update();

        // Perform a sanity check on the actual configuration times to
        // make sure the configurations are spaced the same amount the
        // sample time said they were spaced:

        RealType time2 = times_[j];

        if (std::fabs((time2 - time1) - (j - i) * dtMean_) >
            6 * dtSigma_ * (j - i)) {
          snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                   "TimeCorrFunc::correlateBlocks: mean sampleTime (%f)\n"
                   "\tin %s does not match actual time-spacing between\n"
                   "\tconfigurations %d (t = %f) and %d (t = %f).\n",
                   dtMean_, dumpFilename_.c_str(), i, time1, j, time2);
          if (allowTimeFuzz_) {
            painCave.isFatal  = 0;
            painCave.severity = OPENMD_INFO;
          } else {
            painCave.isFatal  = 1;
            painCave.severity = OPENMD_ERROR;
          }
          simError();
        }

        int timeBin = int((time2 - time1) / dtMean_ + 0.5);
        correlateFrames(i, j, timeBin);
      }
    }
  }